

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

void __thiscall adios2::core::VariableBase::CheckDimensionsCommon(VariableBase *this,string *hint)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  difference_type dVar3;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->m_ShapeID != LocalValue) {
    _Var1._M_current =
         (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var2._M_current =
         (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_Var1._M_current == _Var2._M_current) ||
       (dVar3 = std::
                __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a8), dVar3 < 1))
    {
      _Var1._M_current =
           (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      _Var2._M_current =
           (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if ((_Var1._M_current == _Var2._M_current) ||
         (dVar3 = std::
                  __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                            (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a8), dVar3 < 1
         )) {
        _Var1._M_current =
             (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        _Var2._M_current =
             (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if ((_Var1._M_current == _Var2._M_current) ||
           (dVar3 = std::
                    __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                              (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a8),
           dVar3 < 1)) goto LAB_004547e5;
      }
    }
    std::__cxx11::string::string((string *)&local_30,"Core",&local_91);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_92);
    std::__cxx11::string::string((string *)&local_70,"CheckDimensionsCommon",&local_93);
    std::operator+(&local_90,
                   "LocalValueDim parameter is only allowed as {LocalValueDim} in Shape dimensions "
                   ,hint);
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
LAB_004547e5:
  _Var1._M_current =
       (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var2._M_current =
       (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Var1._M_current == _Var2._M_current) ||
     (dVar3 = std::
              __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a0), dVar3 < 2)) {
    _Var1._M_current =
         (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var2._M_current =
         (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_Var1._M_current == _Var2._M_current) ||
       (dVar3 = std::
                __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a0), dVar3 < 1))
    {
      _Var1._M_current =
           (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      _Var2._M_current =
           (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (_Var1._M_current == _Var2._M_current) {
        return;
      }
      dVar3 = std::
              __count_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (_Var1,_Var2,(_Iter_equals_val<const_unsigned_long>)0x6cf3a0);
      if (dVar3 < 1) {
        return;
      }
    }
  }
  std::__cxx11::string::string((string *)&local_30,"Core",&local_91);
  std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_92);
  std::__cxx11::string::string((string *)&local_70,"CheckDimensionsCommon",&local_93);
  std::operator+(&local_90,
                 "JoinedDim is only allowed once in Shape and cannot appear in start/count, ",hint);
  helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void VariableBase::CheckDimensionsCommon(const std::string hint) const
{
    if (m_ShapeID != ShapeID::LocalValue)
    {
        if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), LocalValueDim) > 0) ||
            (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), LocalValueDim) > 0) ||
            (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), LocalValueDim) > 0))
        {
            helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                                 "LocalValueDim parameter is only "
                                                 "allowed as {LocalValueDim} in Shape dimensions " +
                                                     hint);
        }
    }

    if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), JoinedDim) > 1) ||
        (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), JoinedDim) > 0) ||
        (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), JoinedDim) > 0))
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                             "JoinedDim is only allowed once in "
                                             "Shape and cannot appear in start/count, " +
                                                 hint);
    }
}